

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O0

void wheel_vel(OdometryPtr odm,SpurUserParamsPtr spur)

{
  ParametersPtr p_Var1;
  double dVar2;
  ParametersPtr param;
  int i;
  SpurUserParamsPtr spur_local;
  OdometryPtr odm_local;
  
  p_Var1 = get_param_ptr();
  for (param._4_4_ = MOTOR_RIGHT; (int)param._4_4_ < 0x10; param._4_4_ = param._4_4_ + MOTOR_LEFT) {
    if ((p_Var1->motor_enable[(int)param._4_4_] != 0) &&
       (dVar2 = p(YP_PARAM_VEHICLE_CONTROL,param._4_4_), 0.0 < dVar2)) {
      spur->wheel_mode[(int)param._4_4_] = MOTOR_CONTROL_VEL;
    }
  }
  return;
}

Assistant:

void wheel_vel(OdometryPtr odm, SpurUserParamsPtr spur)
{
  int i;
  ParametersPtr param;
  param = get_param_ptr();

  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!param->motor_enable[i])
      continue;

    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
    {
      spur->wheel_mode[i] = MOTOR_CONTROL_VEL;
    }
  }
}